

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm_suite.cpp
# Opt level: O1

void push_heap_suite::push_decreasing_predicate(void)

{
  int iVar1;
  bool bVar2;
  int __tmp;
  ulong uVar3;
  int __tmp_2;
  ulong uVar4;
  array<int,_4UL> heap;
  array<int,_4UL> expect;
  int local_28 [2];
  
  heap._M_elems[2] = 0;
  heap._M_elems[3] = 0;
  heap._M_elems[0] = 0x2c;
  heap._M_elems[1] = 0;
  expect._M_elems[0] = 0x2c;
  expect._M_elems[1] = 0;
  expect._M_elems[2] = 0;
  expect._M_elems[3] = 0;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0xc4,"void push_heap_suite::push_decreasing_predicate()",heap._M_elems,expect._M_elems
             ,expect._M_elems,local_28);
  iVar1 = heap._M_elems[0];
  heap._M_elems[1] = 0x21;
  if (0x21 < heap._M_elems[0]) {
    heap._M_elems[0] = 0x21;
    heap._M_elems[1] = iVar1;
  }
  expect._M_elems[0] = 0x21;
  expect._M_elems[1] = 0x2c;
  expect._M_elems[2] = 0;
  expect._M_elems[3] = 0;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0xcb,"void push_heap_suite::push_decreasing_predicate()",heap._M_elems,expect._M_elems
             ,expect._M_elems,local_28);
  iVar1 = heap._M_elems[0];
  heap._M_elems[2] = 0x16;
  if (0x16 < heap._M_elems[0]) {
    heap._M_elems[0] = 0x16;
    heap._M_elems[2] = iVar1;
  }
  expect._M_elems[0] = 0x16;
  expect._M_elems[1] = 0x2c;
  expect._M_elems[2] = 0x21;
  expect._M_elems[3] = 0;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0xd2,"void push_heap_suite::push_decreasing_predicate()",heap._M_elems,expect._M_elems
             ,expect._M_elems,local_28);
  heap._M_elems[3] = 0xb;
  uVar3 = 4;
  uVar4 = 2;
  do {
    iVar1 = expect._M_elems[uVar4 - 5];
    if (iVar1 <= expect._M_elems[uVar3 - 5]) break;
    expect._M_elems[uVar4 - 5] = expect._M_elems[uVar3 - 5];
    expect._M_elems[uVar3 - 5] = iVar1;
    bVar2 = 1 < uVar4;
    uVar3 = uVar4;
    uVar4 = uVar4 >> 1;
  } while (bVar2);
  expect._M_elems[0] = 0xb;
  expect._M_elems[1] = 0x16;
  expect._M_elems[2] = 0x21;
  expect._M_elems[3] = 0x2c;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0xd9,"void push_heap_suite::push_decreasing_predicate()",heap._M_elems,expect._M_elems
             ,expect._M_elems,local_28);
  return;
}

Assistant:

void push_decreasing_predicate()
{
    std::array<int, 4> heap = {};
    auto last = heap.begin();
    *last++ = 44;
    vista::push_heap(heap.begin(), last, std::greater<int>{});
    {
        std::array<int, 4> expect = { 44, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 33;
    vista::push_heap(heap.begin(), last, std::greater<int>{});
    {
        std::array<int, 4> expect = { 33, 44, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 22;
    vista::push_heap(heap.begin(), last, std::greater<int>{});
    {
        std::array<int, 4> expect = { 22, 44, 33, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 11;
    vista::push_heap(heap.begin(), last, std::greater<int>{});
    {
        std::array<int, 4> expect = { 11, 22, 33, 44 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
}